

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Initiate.cpp
# Opt level: O0

object get_digest(SRUP_MSG_INIT *self)

{
  char *pcVar1;
  SRUP_MSG_INIT *in_RSI;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *rv;
  SRUP_MSG_INIT *self_local;
  
  self_local = self;
  pcVar1 = SRUP_MSG_INIT::digest(in_RSI);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    boost::python::api::object::object<std::__cxx11::string>
              ((object *)self,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_digest(SRUP_MSG_INIT& self)
{
    const char* rv;
    rv = self.digest();

    if (rv != nullptr)
        return boost::python::object(std::string(rv));
    else
        return boost::python::object();
}